

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catmullclark_patch.h
# Opt level: O3

void __thiscall
embree::GeneralCatmullClarkPatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>::subdivide
          (GeneralCatmullClarkPatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_> *this,
          array_t<embree::CatmullClarkPatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>,_16UL>
          *patch,uint *N_o)

{
  DynamicStackArray<float,_16UL,_64UL> *pDVar1;
  uint *puVar2;
  DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *pDVar3;
  undefined8 *puVar4;
  vfloat_impl<4> *pvVar5;
  undefined8 *puVar6;
  uint uVar7;
  GeneralCatmullClark1RingT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_> *pGVar8;
  long *plVar9;
  undefined1 auVar10 [16];
  undefined8 uVar11;
  long lVar12;
  undefined8 uVar13;
  array_t<embree::CatmullClark1RingT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>,_4UL> *paVar14
  ;
  size_t i;
  long lVar15;
  vfloat_impl<4> *pvVar16;
  float *pfVar17;
  ulong uVar18;
  vfloat_impl<4> **ppvVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  int iVar23;
  uint uVar24;
  Face *pFVar25;
  DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *pDVar26;
  DynamicStackArray<float,_16UL,_64UL> *pDVar27;
  uint uVar28;
  ulong uVar29;
  GeneralCatmullClark1RingT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_> *pGVar30;
  ulong uVar31;
  long lVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar40;
  float fVar41;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  vfloat_impl<4> vVar39;
  float fVar42;
  undefined1 auVar43 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  array_t<embree::vfloat_impl<4>,_32UL> center_ring;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  ulong local_268;
  undefined8 local_238;
  long local_230;
  float afStack_228 [2];
  undefined8 auStack_220 [62];
  
  uVar28 = this->N;
  uVar31 = (ulong)uVar28;
  *N_o = uVar28;
  if (uVar28 != 0) {
    pDVar26 = &patch->items[0].ring.items[0].ring;
    pDVar27 = &patch->items[0].ring.items[0].crease_weight;
    uVar29 = 0;
    do {
      pGVar8 = (this->ring).data;
      pGVar30 = pGVar8 + uVar29;
      patch->items[uVar29].ring.items[0].edge_level = pGVar8[uVar29].edge_level * 0.5;
      patch->items[uVar29].ring.items[0].vertex_level = pGVar8[uVar29].vertex_level * 0.5;
      uVar28 = pGVar8[uVar29].face_valence;
      patch->items[uVar29].ring.items[0].face_valence = uVar28;
      patch->items[uVar29].ring.items[0].edge_valence = uVar28 * 2;
      iVar23 = pGVar8[uVar29].border_face * 2;
      if (pGVar8[uVar29].border_face == -1) {
        iVar23 = -1;
      }
      patch->items[uVar29].ring.items[0].border_index = iVar23;
      fVar33 = pGVar8[uVar29].vertex_crease_weight + -1.0;
      if (fVar33 <= 0.0) {
        fVar33 = 0.0;
      }
      patch->items[uVar29].ring.items[0].vertex_crease_weight = fVar33;
      patch->items[uVar29].ring.items[0].eval_start_index = pGVar8[uVar29].eval_start_face_index;
      patch->items[uVar29].ring.items[0].eval_unique_identifier =
           pGVar8[uVar29].eval_unique_identifier;
      uVar20 = (ulong)pGVar8[uVar29].face_valence;
      if (uVar20 == 0) {
        fVar33 = 0.0;
        local_2b8 = 0.0;
        fStack_2b4 = 0.0;
        fStack_2b0 = 0.0;
        fStack_2ac = 0.0;
        fVar45 = 0.0;
        fVar46 = 0.0;
        fVar47 = 0.0;
        fVar48 = 0.0;
        local_268 = 0;
      }
      else {
        uVar21 = (ulong)pGVar30->eval_start_vertex_index;
        pDVar3 = &patch->items[uVar29].ring.items[0].ring;
        pFVar25 = (pGVar30->faces).data;
        fVar45 = 0.0;
        fVar46 = 0.0;
        fVar47 = 0.0;
        fVar48 = 0.0;
        uVar22 = 0;
        do {
          uVar20 = (pGVar30->eval_start_face_index + uVar22) % uVar20;
          auVar38 = *(undefined1 (*) [16])(pGVar30->vtx).field_0.v;
          iVar23 = pFVar25[uVar20].size;
          if (!CARRY8(uVar21,(long)iVar23)) {
            uVar18 = uVar21;
            auVar37 = auVar38;
            do {
              pvVar16 = (pGVar30->ring).data + uVar18 % (ulong)pGVar30->edge_valence;
              auVar38._0_4_ = auVar37._0_4_ + (pvVar16->field_0).v[0];
              auVar38._4_4_ = auVar37._4_4_ + (pvVar16->field_0).v[1];
              auVar38._8_4_ = auVar37._8_4_ + (pvVar16->field_0).v[2];
              auVar38._12_4_ = auVar37._12_4_ + (pvVar16->field_0).v[3];
              uVar18 = uVar18 + 1;
              auVar37 = auVar38;
            } while (uVar18 <= uVar21 + (long)iVar23);
          }
          pvVar16 = patch->items[uVar29].ring.items[0].ring.data;
          if ((0xf < uVar20) &&
             ((DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)pvVar16 == pDVar3)) {
            pvVar16 = (vfloat_impl<4> *)alignedMalloc(0x800,0x10);
            patch->items[uVar29].ring.items[0].ring.data = pvVar16;
            lVar32 = 0;
            do {
              puVar6 = (undefined8 *)((long)&pDVar26->arr[0].field_0 + lVar32);
              uVar11 = puVar6[1];
              puVar4 = (undefined8 *)
                       ((long)&(patch->items[uVar29].ring.items[0].ring.data)->field_0 + lVar32);
              *puVar4 = *puVar6;
              puVar4[1] = uVar11;
              lVar32 = lVar32 + 0x10;
            } while (lVar32 != 0x200);
            pvVar16 = patch->items[uVar29].ring.items[0].ring.data;
          }
          fVar33 = (float)(iVar23 + 2);
          auVar37._4_4_ = fVar33;
          auVar37._0_4_ = fVar33;
          auVar37._8_4_ = fVar33;
          auVar37._12_4_ = fVar33;
          vVar39.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)divps(auVar38,auVar37);
          pvVar16[uVar20 * 2 + 1].field_0 = vVar39.field_0;
          fVar45 = fVar45 + vVar39.field_0._0_4_;
          fVar46 = fVar46 + vVar39.field_0._4_4_;
          fVar47 = fVar47 + vVar39.field_0._8_4_;
          fVar48 = fVar48 + vVar39.field_0._12_4_;
          pFVar25 = (pGVar30->faces).data;
          uVar21 = (uVar21 + (long)pFVar25[uVar20].size) % (ulong)pGVar30->edge_valence;
          uVar22 = uVar22 + 1;
          uVar20 = (ulong)pGVar30->face_valence;
        } while (uVar22 < uVar20);
        if (uVar20 == 0) {
          fVar33 = 0.0;
          local_2b8 = 0.0;
          fStack_2b4 = 0.0;
          fStack_2b0 = 0.0;
          fStack_2ac = 0.0;
          local_268 = 0;
        }
        else {
          uVar21 = (ulong)pGVar30->eval_start_vertex_index;
          local_2b8 = 0.0;
          fStack_2b4 = 0.0;
          fStack_2b0 = 0.0;
          fStack_2ac = 0.0;
          local_268 = 0;
          uVar22 = 0;
          do {
            uVar20 = (pGVar30->eval_start_face_index + uVar22) % uVar20;
            pvVar16 = (pGVar30->ring).data + uVar21;
            fVar33 = (pGVar30->vtx).field_0.v[0] + (pvVar16->field_0).v[0];
            fVar49 = (pGVar30->vtx).field_0.v[1] + (pvVar16->field_0).v[1];
            fVar50 = (pGVar30->vtx).field_0.v[2] + (pvVar16->field_0).v[2];
            fVar51 = (pGVar30->vtx).field_0.v[3] + (pvVar16->field_0).v[3];
            uVar18 = uVar20 * 2 + 1;
            pvVar16 = patch->items[uVar29].ring.items[0].ring.data;
            if (uVar20 < 0x10) {
LAB_00d435d3:
              pvVar5 = pvVar16 + uVar18;
              fVar36 = (pvVar5->field_0).v[0];
              fVar40 = (pvVar5->field_0).v[1];
              fVar41 = (pvVar5->field_0).v[2];
              fVar42 = (pvVar5->field_0).v[3];
              if (uVar20 != 0) goto LAB_00d435e3;
              uVar28 = patch->items[uVar29].ring.items[0].edge_valence;
              if ((0x20 < uVar28) &&
                 ((DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)pvVar16 == pDVar3)) {
                pvVar16 = (vfloat_impl<4> *)alignedMalloc(0x800,0x10);
                patch->items[uVar29].ring.items[0].ring.data = pvVar16;
                lVar32 = 0;
                do {
                  puVar6 = (undefined8 *)((long)&pDVar26->arr[0].field_0 + lVar32);
                  uVar11 = puVar6[1];
                  puVar4 = (undefined8 *)
                           ((long)&(patch->items[uVar29].ring.items[0].ring.data)->field_0 + lVar32)
                  ;
                  *puVar4 = *puVar6;
                  puVar4[1] = uVar11;
                  lVar32 = lVar32 + 0x10;
                } while (lVar32 != 0x200);
                pvVar16 = patch->items[uVar29].ring.items[0].ring.data;
              }
              pvVar16 = pvVar16 + (uVar28 - 1);
            }
            else {
              if ((DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)pvVar16 == pDVar3) {
                pvVar16 = (vfloat_impl<4> *)alignedMalloc(0x800,0x10);
                patch->items[uVar29].ring.items[0].ring.data = pvVar16;
                lVar32 = 0;
                do {
                  puVar6 = (undefined8 *)((long)&pDVar26->arr[0].field_0 + lVar32);
                  uVar11 = puVar6[1];
                  puVar4 = (undefined8 *)
                           ((long)&(patch->items[uVar29].ring.items[0].ring.data)->field_0 + lVar32)
                  ;
                  *puVar4 = *puVar6;
                  puVar4[1] = uVar11;
                  lVar32 = lVar32 + 0x10;
                } while (lVar32 != 0x200);
                pvVar16 = patch->items[uVar29].ring.items[0].ring.data;
                goto LAB_00d435d3;
              }
              pvVar5 = pvVar16 + uVar18;
              fVar36 = (pvVar5->field_0).v[0];
              fVar40 = (pvVar5->field_0).v[1];
              fVar41 = (pvVar5->field_0).v[2];
              fVar42 = (pvVar5->field_0).v[3];
LAB_00d435e3:
              if ((0x10 < uVar20) &&
                 ((DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)pvVar16 == pDVar3)) {
                pvVar16 = (vfloat_impl<4> *)alignedMalloc(0x800,0x10);
                patch->items[uVar29].ring.items[0].ring.data = pvVar16;
                lVar32 = 0;
                do {
                  puVar6 = (undefined8 *)((long)&pDVar26->arr[0].field_0 + lVar32);
                  uVar11 = puVar6[1];
                  puVar4 = (undefined8 *)
                           ((long)&(patch->items[uVar29].ring.items[0].ring.data)->field_0 + lVar32)
                  ;
                  *puVar4 = *puVar6;
                  puVar4[1] = uVar11;
                  lVar32 = lVar32 + 0x10;
                } while (lVar32 != 0x200);
                pvVar16 = patch->items[uVar29].ring.items[0].ring.data;
              }
              pvVar16 = pvVar16 + uVar20 * 2 + -1;
            }
            fVar36 = fVar36 + (pvVar16->field_0).v[0];
            fVar40 = fVar40 + (pvVar16->field_0).v[1];
            fVar41 = fVar41 + (pvVar16->field_0).v[2];
            fVar42 = fVar42 + (pvVar16->field_0).v[3];
            pvVar16 = (pGVar30->ring).data + uVar21;
            fVar45 = fVar45 + (pvVar16->field_0).v[0];
            fVar46 = fVar46 + (pvVar16->field_0).v[1];
            fVar47 = fVar47 + (pvVar16->field_0).v[2];
            fVar48 = fVar48 + (pvVar16->field_0).v[3];
            fVar34 = (pGVar30->faces).data[uVar20].crease_weight + -1.0;
            pfVar17 = patch->items[uVar29].ring.items[0].crease_weight.data;
            if ((0xf < uVar20) &&
               ((DynamicStackArray<float,_16UL,_64UL> *)pfVar17 ==
                &patch->items[uVar29].ring.items[0].crease_weight)) {
              pfVar17 = (float *)operator_new__(0x100);
              patch->items[uVar29].ring.items[0].crease_weight.data = pfVar17;
              lVar32 = 0;
              do {
                patch->items[uVar29].ring.items[0].crease_weight.data[lVar32] = pDVar27->arr[lVar32]
                ;
                lVar32 = lVar32 + 1;
              } while (lVar32 != 0x10);
              pfVar17 = patch->items[uVar29].ring.items[0].crease_weight.data;
            }
            fVar35 = 0.0;
            if (0.0 <= fVar34) {
              fVar35 = fVar34;
            }
            pfVar17[uVar20] = fVar35;
            if (0.0 < (pGVar30->faces).data[uVar20].crease_weight) {
              pvVar16 = (pGVar30->ring).data + uVar21;
              local_2b8 = local_2b8 + (pvVar16->field_0).v[0];
              fStack_2b4 = fStack_2b4 + (pvVar16->field_0).v[1];
              fStack_2b0 = fStack_2b0 + (pvVar16->field_0).v[2];
              fStack_2ac = fStack_2ac + (pvVar16->field_0).v[3];
              (&local_238)[local_268] = uVar20;
              pvVar16 = patch->items[uVar29].ring.items[0].ring.data;
              if ((0x20 < uVar18) &&
                 ((DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)pvVar16 == pDVar3)) {
                pvVar16 = (vfloat_impl<4> *)alignedMalloc(0x800,0x10);
                patch->items[uVar29].ring.items[0].ring.data = pvVar16;
                lVar32 = 0;
                do {
                  puVar6 = (undefined8 *)((long)&pDVar26->arr[0].field_0 + lVar32);
                  uVar11 = puVar6[1];
                  puVar4 = (undefined8 *)
                           ((long)&(patch->items[uVar29].ring.items[0].ring.data)->field_0 + lVar32)
                  ;
                  *puVar4 = *puVar6;
                  puVar4[1] = uVar11;
                  lVar32 = lVar32 + 0x10;
                } while (lVar32 != 0x200);
                pvVar16 = patch->items[uVar29].ring.items[0].ring.data;
              }
              local_268 = local_268 + 1;
              pvVar16 = pvVar16 + uVar20 * 2;
              (pvVar16->field_0).v[0] = fVar33 * 0.5;
              (pvVar16->field_0).v[1] = fVar49 * 0.5;
              (pvVar16->field_0).v[2] = fVar50 * 0.5;
              (pvVar16->field_0).v[3] = fVar51 * 0.5;
              fVar34 = (pGVar30->faces).data[uVar20].crease_weight;
              if (fVar34 < 1.0) {
                local_288 = (fVar33 + fVar36) * 0.25;
                fStack_284 = (fVar49 + fVar40) * 0.25;
                fStack_280 = (fVar50 + fVar41) * 0.25;
                fStack_27c = (fVar51 + fVar42) * 0.25;
                local_288 = (fVar33 * 0.5 - local_288) * fVar34 + local_288;
                fStack_284 = (fVar49 * 0.5 - fStack_284) * fVar34 + fStack_284;
                fStack_280 = (fVar50 * 0.5 - fStack_280) * fVar34 + fStack_280;
                fStack_27c = (fVar51 * 0.5 - fStack_27c) * fVar34 + fStack_27c;
                pvVar16 = patch->items[uVar29].ring.items[0].ring.data;
                if ((0x20 < uVar18) &&
                   ((DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)pvVar16 == pDVar3)) {
                  pvVar16 = (vfloat_impl<4> *)alignedMalloc(0x800,0x10);
                  patch->items[uVar29].ring.items[0].ring.data = pvVar16;
                  lVar32 = 0;
                  do {
                    puVar6 = (undefined8 *)((long)&pDVar26->arr[0].field_0 + lVar32);
                    uVar11 = puVar6[1];
                    puVar4 = (undefined8 *)
                             ((long)&(patch->items[uVar29].ring.items[0].ring.data)->field_0 +
                             lVar32);
                    *puVar4 = *puVar6;
                    puVar4[1] = uVar11;
                    lVar32 = lVar32 + 0x10;
                  } while (lVar32 != 0x200);
                  goto LAB_00d4399a;
                }
                goto LAB_00d43691;
              }
            }
            else {
              local_288 = (fVar33 + fVar36) * 0.25;
              fStack_284 = (fVar49 + fVar40) * 0.25;
              fStack_280 = (fVar50 + fVar41) * 0.25;
              fStack_27c = (fVar51 + fVar42) * 0.25;
              pvVar16 = patch->items[uVar29].ring.items[0].ring.data;
              if ((0x20 < uVar18) &&
                 ((DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)pvVar16 == pDVar3)) {
                pvVar16 = (vfloat_impl<4> *)alignedMalloc(0x800,0x10);
                patch->items[uVar29].ring.items[0].ring.data = pvVar16;
                lVar32 = 0;
                do {
                  puVar6 = (undefined8 *)((long)&pDVar26->arr[0].field_0 + lVar32);
                  uVar11 = puVar6[1];
                  puVar4 = (undefined8 *)
                           ((long)&(patch->items[uVar29].ring.items[0].ring.data)->field_0 + lVar32)
                  ;
                  *puVar4 = *puVar6;
                  puVar4[1] = uVar11;
                  lVar32 = lVar32 + 0x10;
                } while (lVar32 != 0x200);
LAB_00d4399a:
                pvVar16 = patch->items[uVar29].ring.items[0].ring.data;
              }
LAB_00d43691:
              pvVar16 = pvVar16 + uVar20 * 2;
              (pvVar16->field_0).v[0] = local_288;
              (pvVar16->field_0).v[1] = fStack_284;
              (pvVar16->field_0).v[2] = fStack_280;
              (pvVar16->field_0).v[3] = fStack_27c;
            }
            uVar21 = (uVar21 + (long)(pGVar30->faces).data[uVar20].size) %
                     (ulong)pGVar30->edge_valence;
            uVar22 = uVar22 + 1;
            uVar20 = (ulong)pGVar30->face_valence;
          } while (uVar22 < uVar20);
          fVar33 = (float)uVar20;
        }
      }
      lVar12 = local_230;
      lVar32 = local_238;
      fVar49 = 1.0 / fVar33;
      fVar33 = fVar33 + -2.0;
      fVar45 = (fVar45 * fVar49 + fVar33 * (pGVar30->vtx).field_0.v[0]) * fVar49;
      fVar46 = (fVar46 * fVar49 + fVar33 * (pGVar30->vtx).field_0.v[1]) * fVar49;
      fVar47 = (fVar47 * fVar49 + fVar33 * (pGVar30->vtx).field_0.v[2]) * fVar49;
      fVar49 = (fVar48 * fVar49 + fVar33 * (pGVar30->vtx).field_0.v[3]) * fVar49;
      patch->items[uVar29].ring.items[0].vtx.field_0.v[0] = fVar45;
      patch->items[uVar29].ring.items[0].vtx.field_0.v[1] = fVar46;
      patch->items[uVar29].ring.items[0].vtx.field_0.v[2] = fVar47;
      patch->items[uVar29].ring.items[0].vtx.field_0.v[3] = fVar49;
      fVar33 = pGVar30->vertex_crease_weight;
      if (0.0 < fVar33) {
        if (1.0 <= fVar33) {
          fVar48 = (pGVar30->vtx).field_0.v[0];
          fVar50 = (pGVar30->vtx).field_0.v[1];
          fVar51 = (pGVar30->vtx).field_0.v[2];
          fVar36 = (pGVar30->vtx).field_0.v[3];
        }
        else {
          fVar48 = (pGVar30->vtx).field_0.v[0];
          fVar50 = (pGVar30->vtx).field_0.v[1];
          fVar51 = (pGVar30->vtx).field_0.v[2];
          fVar36 = (pGVar30->vtx).field_0.v[3];
          fVar48 = (fVar45 - fVar48) * fVar33 + fVar48;
          fVar50 = (fVar46 - fVar50) * fVar33 + fVar50;
          fVar51 = (fVar47 - fVar51) * fVar33 + fVar51;
          fVar36 = (fVar49 - fVar36) * fVar33 + fVar36;
        }
LAB_00d440ea:
        patch->items[uVar29].ring.items[0].vtx.field_0.v[0] = fVar48;
        patch->items[uVar29].ring.items[0].vtx.field_0.v[1] = fVar50;
        patch->items[uVar29].ring.items[0].vtx.field_0.v[2] = fVar51;
        patch->items[uVar29].ring.items[0].vtx.field_0.v[3] = fVar36;
      }
      else if (1 < local_268) {
        fVar48 = (pGVar30->vtx).field_0.v[0];
        fVar50 = (pGVar30->vtx).field_0.v[1];
        fVar51 = (pGVar30->vtx).field_0.v[2];
        fVar36 = (pGVar30->vtx).field_0.v[3];
        if (local_268 == 2) {
          fVar48 = (local_2b8 + fVar48 * 6.0) * 0.125;
          fVar50 = (fStack_2b4 + fVar50 * 6.0) * 0.125;
          fVar51 = (fStack_2b0 + fVar51 * 6.0) * 0.125;
          fVar36 = (fStack_2ac + fVar36 * 6.0) * 0.125;
          pFVar25 = (pGVar30->faces).data;
          fVar33 = pFVar25[local_238].crease_weight;
          fVar40 = pFVar25[local_230].crease_weight;
          patch->items[uVar29].ring.items[0].vtx.field_0.v[0] = fVar48;
          patch->items[uVar29].ring.items[0].vtx.field_0.v[1] = fVar50;
          patch->items[uVar29].ring.items[0].vtx.field_0.v[2] = fVar51;
          patch->items[uVar29].ring.items[0].vtx.field_0.v[3] = fVar36;
          fVar41 = (fVar33 * 3.0 + fVar40) * 0.25 + -1.0;
          pDVar1 = &patch->items[uVar29].ring.items[0].crease_weight;
          if ((0x10 < local_238 + 1U) &&
             ((DynamicStackArray<float,_16UL,_64UL> *)
              patch->items[uVar29].ring.items[0].crease_weight.data == pDVar1)) {
            pfVar17 = (float *)operator_new__(0x100);
            patch->items[uVar29].ring.items[0].crease_weight.data = pfVar17;
            lVar15 = 0;
            do {
              patch->items[uVar29].ring.items[0].crease_weight.data[lVar15] = pDVar27->arr[lVar15];
              lVar15 = lVar15 + 1;
            } while (lVar15 != 0x10);
          }
          fVar42 = 0.0;
          if (0.0 <= fVar41) {
            fVar42 = fVar41;
          }
          patch->items[uVar29].ring.items[0].crease_weight.data[lVar32] = fVar42;
          fVar41 = (fVar40 * 3.0 + fVar33) * 0.25 + -1.0;
          pfVar17 = patch->items[uVar29].ring.items[0].crease_weight.data;
          if ((0x10 < lVar12 + 1U) && ((DynamicStackArray<float,_16UL,_64UL> *)pfVar17 == pDVar1)) {
            pfVar17 = (float *)operator_new__(0x100);
            patch->items[uVar29].ring.items[0].crease_weight.data = pfVar17;
            lVar32 = 0;
            do {
              patch->items[uVar29].ring.items[0].crease_weight.data[lVar32] = pDVar27->arr[lVar32];
              lVar32 = lVar32 + 1;
            } while (lVar32 != 0x10);
            pfVar17 = patch->items[uVar29].ring.items[0].crease_weight.data;
          }
          fVar42 = 0.0;
          if (0.0 <= fVar41) {
            fVar42 = fVar41;
          }
          pfVar17[lVar12] = fVar42;
          fVar33 = (fVar33 + fVar40) * 0.5;
          if (1.0 <= fVar33) goto LAB_00d43f57;
          fVar48 = (fVar45 - fVar48) * fVar33 + fVar48;
          fVar50 = (fVar46 - fVar50) * fVar33 + fVar50;
          fVar51 = (fVar47 - fVar51) * fVar33 + fVar51;
          fVar36 = (fVar49 - fVar36) * fVar33 + fVar36;
        }
        goto LAB_00d440ea;
      }
LAB_00d43f57:
      uVar21 = uVar29 + 1;
      patch->items[uVar29].ring.items[0].edge_level = (this->ring).data[uVar29].edge_level * 0.5;
      uVar20 = 0;
      if (uVar21 != uVar31) {
        uVar20 = uVar21;
      }
      patch->items[uVar20].ring.items[3].edge_level = (this->ring).data[uVar29].edge_level * 0.5;
      uVar31 = (ulong)this->N;
      pDVar26 = (DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)
                ((long)(pDVar26 + 5) + 0x1c0);
      pDVar27 = pDVar27 + 0x1a;
      uVar29 = uVar21;
    } while (uVar21 < uVar31);
    if (this->N != 0) {
      pGVar30 = (this->ring).data;
      ppvVar19 = &patch->items[0].ring.items[1].ring.data;
      uVar28 = 1;
      lVar32 = 0;
      uVar29 = 0;
      auVar38 = ZEXT816(0);
      fVar33 = 2.0;
      do {
        iVar23 = (int)uVar29;
        uVar29 = uVar29 + 1;
        uVar20 = 0;
        if (uVar29 != uVar31) {
          uVar20 = uVar29;
        }
        if ((*(int *)((long)&pGVar30->border_face + lVar32) ==
             *(int *)((long)&pGVar30->face_valence + lVar32) + -1) ||
           (pGVar30[uVar20].face_valence < 3)) {
          *(float *)(ppvVar19 + -0x48) = *(float *)((long)ppvVar19 + -0x57c);
          patch->items[uVar20].ring.items[3].vertex_level = *(float *)((long)ppvVar19 + -0x57c);
          *(undefined4 *)((long)ppvVar19 + -0x2fc) = 3;
          patch->items[uVar20].ring.items[3].face_valence = 3;
          *(undefined4 *)(ppvVar19 + -0x5f) = 6;
          patch->items[uVar20].ring.items[3].edge_valence = 6;
          *(undefined4 *)(ppvVar19 + -0x60) = 2;
          patch->items[uVar20].ring.items[3].border_index = 4;
          plVar9 = (long *)ppvVar19[-0x68];
          lVar12 = *plVar9;
          lVar15 = plVar9[1];
          ppvVar19[-0x46] = (vfloat_impl<4> *)lVar12;
          ppvVar19[-0x45] = (vfloat_impl<4> *)lVar15;
          paVar14 = &patch->items[uVar20].ring;
          *(long *)&paVar14->items[3].vtx.field_0 = lVar12;
          *(long *)((long)&paVar14->items[3].vtx.field_0 + 8) = lVar15;
          *(undefined4 *)((long)ppvVar19 + -0x2f4) = 0;
          patch->items[uVar20].ring.items[3].vertex_crease_weight = 0.0;
          lVar12 = plVar9[2];
          lVar15 = plVar9[3];
          pvVar16 = *ppvVar19;
          *(long *)&pvVar16->field_0 = lVar12;
          *(long *)((long)&pvVar16->field_0 + 8) = lVar15;
          pvVar16 = patch->items[uVar20].ring.items[3].ring.data;
          *(long *)&pvVar16[2].field_0 = lVar12;
          *(long *)((long)&pvVar16[2].field_0 + 8) = lVar15;
          pvVar16 = patch->items[uVar20].ring.items[0].ring.data;
          uVar11 = *(undefined8 *)&pvVar16->field_0;
          uVar13 = *(undefined8 *)((long)&pvVar16->field_0 + 8);
          pvVar16 = *ppvVar19;
          *(undefined8 *)&pvVar16[5].field_0 = uVar11;
          *(undefined8 *)((long)&pvVar16[5].field_0 + 8) = uVar13;
          pvVar16 = patch->items[uVar20].ring.items[3].ring.data;
          *(undefined8 *)&pvVar16[1].field_0 = uVar11;
          *(undefined8 *)((long)&pvVar16[1].field_0 + 8) = uVar13;
          paVar14 = &patch->items[uVar20].ring;
          uVar11 = *(undefined8 *)&paVar14->items[0].vtx.field_0;
          uVar13 = *(undefined8 *)((long)&paVar14->items[0].vtx.field_0 + 8);
          pvVar16 = *ppvVar19;
          *(undefined8 *)&pvVar16[4].field_0 = uVar11;
          *(undefined8 *)((long)&pvVar16[4].field_0 + 8) = uVar13;
          pvVar16 = patch->items[uVar20].ring.items[3].ring.data;
          *(undefined8 *)&pvVar16->field_0 = uVar11;
          *(undefined8 *)((long)&pvVar16->field_0 + 8) = uVar13;
          puVar6 = (undefined8 *)((long)ppvVar19[-0x68] + 0x10 + (long)(int)ppvVar19[-200] * 0x10);
          uVar11 = *puVar6;
          uVar13 = puVar6[1];
          pvVar16 = *ppvVar19;
          *(undefined8 *)&pvVar16[3].field_0 = uVar11;
          *(undefined8 *)((long)&pvVar16[3].field_0 + 8) = uVar13;
          pvVar16 = patch->items[uVar20].ring.items[3].ring.data;
          *(undefined8 *)&pvVar16[5].field_0 = uVar11;
          *(undefined8 *)((long)&pvVar16[5].field_0 + 8) = uVar13;
          lVar12 = (long)ppvVar19[-0xae];
          lVar15 = (long)ppvVar19[-0xad];
          pvVar16 = *ppvVar19;
          *(long *)&pvVar16[2].field_0 = lVar12;
          *(long *)((long)&pvVar16[2].field_0 + 8) = lVar15;
          pvVar16 = patch->items[uVar20].ring.items[3].ring.data;
          *(long *)&pvVar16[4].field_0 = lVar12;
          *(long *)((long)&pvVar16[4].field_0 + 8) = lVar15;
          uVar11 = *(undefined8 *)((long)ppvVar19[-0x68] + 0x20);
          uVar13 = *(undefined8 *)((long)ppvVar19[-0x68] + 0x28);
          pvVar16 = *ppvVar19;
          *(undefined8 *)&pvVar16[1].field_0 = uVar11;
          *(undefined8 *)((long)&pvVar16[1].field_0 + 8) = uVar13;
          pvVar16 = patch->items[uVar20].ring.items[3].ring.data;
          *(undefined8 *)&pvVar16[3].field_0 = uVar11;
          *(undefined8 *)((long)&pvVar16[3].field_0 + 8) = uVar13;
          *(undefined4 *)ppvVar19[-0x50] = 0;
          patch->items[uVar20].ring.items[3].crease_weight.data[1] = 0.0;
          fVar45 = patch->items[uVar20].ring.items[0].crease_weight.data[1];
          *(float *)((long)ppvVar19[-0x50] + 8) = fVar45;
          *patch->items[uVar20].ring.items[3].crease_weight.data = fVar45;
          fVar45 = *(float *)ppvVar19[-0xb8];
          *(float *)((long)ppvVar19[-0x50] + 4) = fVar45;
          patch->items[uVar20].ring.items[3].crease_weight.data[2] = fVar45;
          uVar24 = *(uint *)((long)ppvVar19 + -0x574);
          uVar7 = patch->items[uVar20].ring.items[0].eval_unique_identifier;
          if (uVar7 < uVar24) {
            *(undefined4 *)(ppvVar19 + -0x47) = 2;
            patch->items[uVar20].ring.items[3].eval_start_index = 0;
            *(uint *)((long)ppvVar19 + -0x234) = uVar7;
            patch->items[uVar20].ring.items[3].eval_unique_identifier = uVar7;
          }
          else {
            *(undefined4 *)(ppvVar19 + -0x47) = 1;
            patch->items[uVar20].ring.items[3].eval_start_index = 2;
            *(uint *)((long)ppvVar19 + -0x234) = uVar24;
            patch->items[uVar20].ring.items[3].eval_unique_identifier = uVar24;
          }
        }
        else {
          *(float *)(ppvVar19 + -0x48) = *(float *)((long)ppvVar19 + -0x57c);
          patch->items[uVar20].ring.items[3].vertex_level = *(float *)((long)ppvVar19 + -0x57c);
          *(undefined4 *)((long)ppvVar19 + -0x2fc) = 4;
          patch->items[uVar20].ring.items[3].face_valence = 4;
          *(undefined4 *)(ppvVar19 + -0x5f) = 8;
          patch->items[uVar20].ring.items[3].edge_valence = 8;
          *(undefined4 *)(ppvVar19 + -0x60) = 0xffffffff;
          patch->items[uVar20].ring.items[3].border_index = -1;
          plVar9 = (long *)ppvVar19[-0x68];
          lVar12 = *plVar9;
          lVar15 = plVar9[1];
          ppvVar19[-0x46] = (vfloat_impl<4> *)lVar12;
          ppvVar19[-0x45] = (vfloat_impl<4> *)lVar15;
          paVar14 = &patch->items[uVar20].ring;
          *(long *)&paVar14->items[3].vtx.field_0 = lVar12;
          *(long *)((long)&paVar14->items[3].vtx.field_0 + 8) = lVar15;
          *(undefined4 *)((long)ppvVar19 + -0x2f4) = 0;
          patch->items[uVar20].ring.items[3].vertex_crease_weight = 0.0;
          lVar12 = plVar9[2];
          lVar15 = plVar9[3];
          pvVar16 = *ppvVar19;
          *(long *)&pvVar16->field_0 = lVar12;
          *(long *)((long)&pvVar16->field_0 + 8) = lVar15;
          pvVar16 = patch->items[uVar20].ring.items[3].ring.data;
          *(long *)&pvVar16[2].field_0 = lVar12;
          *(long *)((long)&pvVar16[2].field_0 + 8) = lVar15;
          pvVar16 = patch->items[uVar20].ring.items[0].ring.data;
          uVar11 = *(undefined8 *)&pvVar16->field_0;
          uVar13 = *(undefined8 *)((long)&pvVar16->field_0 + 8);
          pvVar16 = *ppvVar19;
          *(undefined8 *)&pvVar16[7].field_0 = uVar11;
          *(undefined8 *)((long)&pvVar16[7].field_0 + 8) = uVar13;
          pvVar16 = patch->items[uVar20].ring.items[3].ring.data;
          *(undefined8 *)&pvVar16[1].field_0 = uVar11;
          *(undefined8 *)((long)&pvVar16[1].field_0 + 8) = uVar13;
          paVar14 = &patch->items[uVar20].ring;
          uVar11 = *(undefined8 *)&paVar14->items[0].vtx.field_0;
          uVar13 = *(undefined8 *)((long)&paVar14->items[0].vtx.field_0 + 8);
          pvVar16 = *ppvVar19;
          *(undefined8 *)&pvVar16[6].field_0 = uVar11;
          *(undefined8 *)((long)&pvVar16[6].field_0 + 8) = uVar13;
          pvVar16 = patch->items[uVar20].ring.items[3].ring.data;
          *(undefined8 *)&pvVar16->field_0 = uVar11;
          *(undefined8 *)((long)&pvVar16->field_0 + 8) = uVar13;
          pvVar16 = patch->items[uVar20].ring.items[0].ring.data;
          uVar11 = *(undefined8 *)&pvVar16[4].field_0;
          uVar13 = *(undefined8 *)((long)&pvVar16[4].field_0 + 8);
          pvVar16 = *ppvVar19;
          *(undefined8 *)&pvVar16[5].field_0 = uVar11;
          *(undefined8 *)((long)&pvVar16[5].field_0 + 8) = uVar13;
          pvVar16 = patch->items[uVar20].ring.items[3].ring.data;
          *(undefined8 *)&pvVar16[7].field_0 = uVar11;
          *(undefined8 *)((long)&pvVar16[7].field_0 + 8) = uVar13;
          puVar6 = (undefined8 *)((long)ppvVar19[-0x68] + (ulong)((int)ppvVar19[-199] - 1) * 0x10);
          uVar11 = *puVar6;
          uVar13 = puVar6[1];
          pvVar16 = *ppvVar19;
          *(undefined8 *)&pvVar16[4].field_0 = uVar11;
          *(undefined8 *)((long)&pvVar16[4].field_0 + 8) = uVar13;
          pvVar16 = patch->items[uVar20].ring.items[3].ring.data;
          *(undefined8 *)&pvVar16[6].field_0 = uVar11;
          *(undefined8 *)((long)&pvVar16[6].field_0 + 8) = uVar13;
          puVar6 = (undefined8 *)((long)ppvVar19[-0x68] + (ulong)((int)ppvVar19[-199] - 2) * 0x10);
          uVar11 = *puVar6;
          uVar13 = puVar6[1];
          pvVar16 = *ppvVar19;
          *(undefined8 *)&pvVar16[3].field_0 = uVar11;
          *(undefined8 *)((long)&pvVar16[3].field_0 + 8) = uVar13;
          pvVar16 = patch->items[uVar20].ring.items[3].ring.data;
          *(undefined8 *)&pvVar16[5].field_0 = uVar11;
          *(undefined8 *)((long)&pvVar16[5].field_0 + 8) = uVar13;
          lVar12 = (long)ppvVar19[-0xae];
          lVar15 = (long)ppvVar19[-0xad];
          pvVar16 = *ppvVar19;
          *(long *)&pvVar16[2].field_0 = lVar12;
          *(long *)((long)&pvVar16[2].field_0 + 8) = lVar15;
          pvVar16 = patch->items[uVar20].ring.items[3].ring.data;
          *(long *)&pvVar16[4].field_0 = lVar12;
          *(long *)((long)&pvVar16[4].field_0 + 8) = lVar15;
          uVar11 = *(undefined8 *)((long)ppvVar19[-0x68] + 0x20);
          uVar13 = *(undefined8 *)((long)ppvVar19[-0x68] + 0x28);
          pvVar16 = *ppvVar19;
          *(undefined8 *)&pvVar16[1].field_0 = uVar11;
          *(undefined8 *)((long)&pvVar16[1].field_0 + 8) = uVar13;
          pvVar16 = patch->items[uVar20].ring.items[3].ring.data;
          *(undefined8 *)&pvVar16[3].field_0 = uVar11;
          *(undefined8 *)((long)&pvVar16[3].field_0 + 8) = uVar13;
          *(undefined4 *)ppvVar19[-0x50] = 0;
          patch->items[uVar20].ring.items[3].crease_weight.data[1] = 0.0;
          fVar45 = patch->items[uVar20].ring.items[0].crease_weight.data[1];
          *(float *)((long)ppvVar19[-0x50] + 0xc) = fVar45;
          *patch->items[uVar20].ring.items[3].crease_weight.data = fVar45;
          *(undefined4 *)((long)ppvVar19[-0x50] + 8) = 0;
          patch->items[uVar20].ring.items[3].crease_weight.data[3] = 0.0;
          fVar45 = *(float *)ppvVar19[-0xb8];
          *(float *)((long)ppvVar19[-0x50] + 4) = fVar45;
          patch->items[uVar20].ring.items[3].crease_weight.data[2] = fVar45;
          uVar24 = *(uint *)((long)ppvVar19 + -0x574);
          uVar7 = patch->items[uVar20].ring.items[0].eval_unique_identifier;
          if (uVar7 < uVar24) {
            *(undefined4 *)(ppvVar19 + -0x47) = 1;
            patch->items[uVar20].ring.items[3].eval_start_index = 2;
            *(uint *)((long)ppvVar19 + -0x234) = uVar7;
            patch->items[uVar20].ring.items[3].eval_unique_identifier = uVar7;
          }
          else {
            *(undefined4 *)(ppvVar19 + -0x47) = 3;
            patch->items[uVar20].ring.items[3].eval_start_index = 0;
            *(uint *)((long)ppvVar19 + -0x234) = uVar24;
            patch->items[uVar20].ring.items[3].eval_unique_identifier = uVar24;
          }
        }
        pGVar30 = (this->ring).data;
        fVar45 = (pGVar30[(ulong)((iVar23 + (int)uVar31) - 1) % uVar31].edge_level +
                 pGVar30[uVar20].edge_level) * 0.25;
        patch->items[uVar20].ring.items[2].edge_level = fVar45;
        *(float *)((long)ppvVar19 + -0x23c) = fVar45;
        if (fVar45 <= fVar33) {
          fVar45 = fVar33;
        }
        pGVar30 = (this->ring).data;
        pfVar17 = (float *)((long)((pGVar30->ring).arr + -4) + lVar32);
        auVar43._0_4_ = auVar38._0_4_ + *pfVar17;
        auVar43._4_4_ = auVar38._4_4_ + pfVar17[1];
        auVar43._8_4_ = auVar38._8_4_ + pfVar17[2];
        auVar43._12_4_ = auVar38._12_4_ + pfVar17[3];
        lVar12 = (long)ppvVar19[-0xad];
        (&local_238)[(ulong)(uVar28 - 1) * 2] = ppvVar19[-0xae];
        *(long *)(afStack_228 + ((ulong)(uVar28 - 1) * 2 + -1) * 2) = lVar12;
        uVar11 = *(undefined8 *)((long)ppvVar19[-0x68] + 8);
        (&local_238)[(ulong)uVar28 * 2] = *(undefined8 *)ppvVar19[-0x68];
        *(undefined8 *)(afStack_228 + ((ulong)uVar28 * 2 + -1) * 2) = uVar11;
        uVar31 = (ulong)this->N;
        lVar32 = lVar32 + 0x380;
        ppvVar19 = ppvVar19 + 0x1a0;
        uVar28 = uVar28 + 2;
        auVar38 = auVar43;
        fVar33 = fVar45;
      } while (uVar29 < uVar31);
      if (this->N != 0) {
        fVar33 = (float)uVar31;
        auVar10._4_4_ = fVar33;
        auVar10._0_4_ = fVar33;
        auVar10._8_4_ = fVar33;
        auVar10._12_4_ = fVar33;
        aVar44 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)divps(auVar43,auVar10);
        pDVar26 = &patch->items[0].ring.items[2].ring;
        pDVar27 = &patch->items[0].ring.items[2].crease_weight;
        uVar29 = 0;
        do {
          patch->items[uVar29].ring.items[2].vertex_level = fVar45;
          uVar24 = (uint)uVar31;
          patch->items[uVar29].ring.items[2].face_valence = uVar24;
          uVar28 = uVar24 * 2;
          patch->items[uVar29].ring.items[2].edge_valence = uVar28;
          patch->items[uVar29].ring.items[2].border_index = -1;
          patch->items[uVar29].ring.items[2].vtx.field_0 = aVar44;
          patch->items[uVar29].ring.items[2].vertex_crease_weight = 0.0;
          if (uVar28 != 0) {
            uVar31 = 0;
            do {
              uVar20 = (ulong)((int)uVar29 * 2 + uVar28 + -1 + (int)uVar31) % (ulong)uVar28;
              fVar33 = *(float *)(&local_238 + uVar20 * 2);
              fVar46 = *(float *)((long)&local_238 + uVar20 * 0x10 + 4);
              fVar47 = afStack_228[(uVar20 * 2 + -1) * 2];
              fVar48 = afStack_228[uVar20 * 4 + -1];
              pvVar16 = patch->items[uVar29].ring.items[2].ring.data;
              if ((0x1f < uVar31) &&
                 ((DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)pvVar16 ==
                  &patch->items[uVar29].ring.items[2].ring)) {
                pvVar16 = (vfloat_impl<4> *)alignedMalloc(0x800,0x10);
                patch->items[uVar29].ring.items[2].ring.data = pvVar16;
                lVar32 = 0;
                do {
                  puVar6 = (undefined8 *)((long)&pDVar26->arr[0].field_0 + lVar32);
                  uVar11 = puVar6[1];
                  puVar4 = (undefined8 *)
                           ((long)&(patch->items[uVar29].ring.items[2].ring.data)->field_0 + lVar32)
                  ;
                  *puVar4 = *puVar6;
                  puVar4[1] = uVar11;
                  lVar32 = lVar32 + 0x10;
                } while (lVar32 != 0x200);
                pvVar16 = patch->items[uVar29].ring.items[2].ring.data;
              }
              uVar20 = uVar31 + 1;
              pvVar16 = pvVar16 + uVar31;
              (pvVar16->field_0).v[0] = fVar33;
              (pvVar16->field_0).v[1] = fVar46;
              (pvVar16->field_0).v[2] = fVar47;
              (pvVar16->field_0).v[3] = fVar48;
              uVar31 = uVar20;
            } while (uVar20 != uVar28);
          }
          uVar31 = 0;
          do {
            pfVar17 = patch->items[uVar29].ring.items[2].crease_weight.data;
            if ((0xf < uVar31) &&
               ((DynamicStackArray<float,_16UL,_64UL> *)pfVar17 ==
                &patch->items[uVar29].ring.items[2].crease_weight)) {
              pfVar17 = (float *)operator_new__(0x100);
              patch->items[uVar29].ring.items[2].crease_weight.data = pfVar17;
              lVar32 = 0;
              do {
                patch->items[uVar29].ring.items[2].crease_weight.data[lVar32] = pDVar27->arr[lVar32]
                ;
                lVar32 = lVar32 + 1;
              } while (lVar32 != 0x10);
              pfVar17 = patch->items[uVar29].ring.items[2].crease_weight.data;
            }
            pfVar17[uVar31] = 0.0;
            uVar31 = uVar31 + 1;
          } while (uVar31 != uVar24 + (uVar24 == 0));
          uVar28 = uVar28 + (int)uVar29 * -2 >> 1;
          patch->items[uVar29].ring.items[2].eval_start_index = uVar28;
          puVar2 = &patch->items[uVar29].ring.items[2].face_valence;
          if (*puVar2 <= uVar28) {
            patch->items[uVar29].ring.items[2].eval_start_index = uVar28 - *puVar2;
          }
          patch->items[uVar29].ring.items[2].eval_unique_identifier = 0;
          uVar29 = uVar29 + 1;
          uVar31 = (ulong)this->N;
          pDVar26 = (DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)
                    ((long)(pDVar26 + 5) + 0x1c0);
          pDVar27 = pDVar27 + 0x1a;
        } while (uVar29 < uVar31);
      }
    }
  }
  return;
}

Assistant:

__noinline void subdivide(array_t<CatmullClarkPatch,SIZE>& patch, unsigned& N_o) const
    {
      N_o = N;
      assert( N );
      for (unsigned i=0; i<N; i++) {
        unsigned ip1 = (i+1)%N; // FIXME: %
        ring[i].subdivide(patch[i].ring[0]);
        patch[i]  .ring[0].edge_level = 0.5f*ring[i].edge_level;
        patch[ip1].ring[3].edge_level = 0.5f*ring[i].edge_level;
        
	assert( patch[i].ring[0].hasValidPositions() );
        
      }
      assert(N < 2*SIZE);
      Vertex_t center = Vertex_t(0.0f);
      array_t<Vertex_t,2*SIZE> center_ring;
      float center_vertex_level = 2.0f; // guarantees that irregular vertices get always isolated also for non-quads
      
      for (unsigned i=0; i<N; i++)
      {
        unsigned ip1 = (i+1)%N; // FIXME: %
        unsigned im1 = (i+N-1)%N; // FIXME: %
        bool regular = ring[i].has_last_face() && ring[ip1].face_valence > 2;
        if (likely(regular)) init_regular(patch[i].ring[0],patch[ip1].ring[0],patch[i].ring[1],patch[ip1].ring[3]); 
        else                 init_border (patch[i].ring[0],patch[ip1].ring[0],patch[i].ring[1],patch[ip1].ring[3]);
        
	assert( patch[i].ring[1].hasValidPositions() );
	assert( patch[ip1].ring[3].hasValidPositions() );
        
	float level = 0.25f*(ring[im1].edge_level+ring[ip1].edge_level);
        patch[i].ring[1].edge_level = patch[ip1].ring[2].edge_level = level;
	center_vertex_level = max(center_vertex_level,level);
        
        center += ring[i].vtx;
        center_ring[2*i+0] = (Vertex_t)patch[i].ring[0].vtx;
        center_ring[2*i+1] = (Vertex_t)patch[i].ring[0].ring[0];
      }
      center /= float(N);
      
      for (unsigned int i=0; i<N; i++) {
        init_regular(center,center_ring,center_vertex_level,N,2*i,patch[i].ring[2]);
        
	assert( patch[i].ring[2].hasValidPositions() );
      }
    }